

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O1

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenEnum
          (LobsterGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumVal *ev;
  undefined8 *puVar2;
  long *plVar3;
  pointer ppEVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  long *local_148;
  long local_138;
  long lStack_130;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  string local_e8;
  string *local_c8;
  string local_c0;
  string local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  LobsterGenerator *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    CheckNameSpace(this,&enum_def->super_Definition,code_ptr);
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    EscapeKeyword(&local_e8,this,(string *)enum_def);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x36f44f);
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_118 = *plVar3;
      uStack_110 = puVar2[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar3;
      local_128 = (long *)*puVar2;
    }
    local_120 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
    local_148 = &local_138;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_138 = *plVar5;
      lStack_130 = plVar3[3];
    }
    else {
      local_138 = *plVar5;
      local_148 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_148);
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    local_c8 = code_ptr;
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    paVar1 = &local_e8.field_2;
    local_60 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    ppEVar4 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar4 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        ev = *ppEVar4;
        local_58 = ppEVar4;
        GenComment(&ev->doc_comment,local_c8,(CommentConfig *)0x0,"    ");
        std::operator+(&local_50,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def
                      );
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        puVar6 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar6) {
          local_70 = *puVar6;
          lStack_68 = plVar3[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *puVar6;
          local_80 = (ulong *)*plVar3;
        }
        local_78 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        EscapeKeyword(&local_a0,local_60,&ev->name);
        uVar7 = 0xf;
        if (local_80 != &local_70) {
          uVar7 = local_70;
        }
        if (uVar7 < local_a0._M_string_length + local_78) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            uVar8 = local_a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_a0._M_string_length + local_78) goto LAB_002a08ec;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
        }
        else {
LAB_002a08ec:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
        }
        local_108 = &local_f8;
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_f8 = *plVar3;
          uStack_f0 = puVar2[3];
        }
        else {
          local_f8 = *plVar3;
          local_108 = (long *)*puVar2;
        }
        local_100 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_108);
        puVar6 = (ulong *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar6) {
          local_e8.field_2._M_allocated_capacity = *puVar6;
          local_e8.field_2._8_8_ = plVar3[3];
          local_e8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *puVar6;
          local_e8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_e8._M_string_length = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        EnumDef::ToString_abi_cxx11_(&local_c0,enum_def,ev);
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          uVar8 = local_e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_c0._M_string_length + local_e8._M_string_length) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            uVar8 = local_c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_c0._M_string_length + local_e8._M_string_length)
          goto LAB_002a0a14;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_c0,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p);
        }
        else {
LAB_002a0a14:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e8,(ulong)local_c0._M_dataplus._M_p);
        }
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_118 = *plVar3;
          uStack_110 = puVar2[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *plVar3;
          local_128 = (long *)*puVar2;
        }
        local_120 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
        local_148 = &local_138;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_138 = *plVar5;
          lStack_130 = plVar3[3];
        }
        else {
          local_138 = *plVar5;
          local_148 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_c8,(ulong)local_148);
        if (local_148 != &local_138) {
          operator_delete(local_148,local_138 + 1);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128,local_118 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppEVar4 = local_58 + 1;
      } while (ppEVar4 !=
               (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)local_c8);
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(enum_def, &code);
    GenComment(enum_def.doc_comment, code_ptr, nullptr, "");
    code += "enum " + NormalizedName(enum_def) + ":\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, "    ");
      code += "    " + enum_def.name + "_" + NormalizedName(ev) + " = " +
              enum_def.ToString(ev) + "\n";
    }
    code += "\n";
  }